

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O3

void all_stack_dump(DLword start,DLword end,DLword silent)

{
  frameex1 *pfVar1;
  ushort uVar2;
  ushort uVar3;
  LispPTR x;
  int iVar4;
  uint uVar5;
  ushort *puVar6;
  char *__format;
  frameex1 *fx_addr68k;
  undefined6 in_register_0000003a;
  ulong uVar7;
  int iVar8;
  frameex1 *pfVar9;
  
  uVar7 = CONCAT62(in_register_0000003a,start);
  if ((int)uVar7 == 0) {
    uVar7 = (ulong)InterfacePage->stackbase;
  }
  if (end == 0) {
    end = InterfacePage->endofstack;
  }
  if ((ushort)uVar7 < end) {
    fx_addr68k = (frameex1 *)(Stackspace + (uVar7 & 0xffff));
    pfVar1 = (frameex1 *)(Stackspace + end);
    iVar8 = 0;
    do {
      uVar2 = *(ushort *)((ulong)fx_addr68k ^ 2);
      uVar3 = uVar2 >> 0xd;
      if (uVar3 == 5) {
LAB_00134459:
        if ((uVar2 & 0x1fff) == 0) {
          puVar6 = (ushort *)((ulong)&fx_addr68k->field_0x2 ^ 2);
          uVar3 = *puVar6;
          __format = "\n0x%x FSB,   size : 0x%x";
          if (uVar2 == 0xe000) {
            __format = "\n0x%x GUARD, size : 0x%x";
          }
          if (((ulong)fx_addr68k & 1) != 0) {
            printf("Misaligned pointer in LAddrFromNative %p\n",fx_addr68k);
          }
          printf(__format,(ulong)((long)fx_addr68k - (long)Lisp_world) >> 1,(ulong)uVar3);
          if ((uVar3 != 0) && ((long)(ulong)uVar3 <= (long)pfVar1 - (long)fx_addr68k >> 1)) {
            if (iVar8 < 0x1e) {
              iVar8 = iVar8 + 1;
            }
            else {
              iVar8 = 0;
              printf("\nPress Return:(to quit Esc and Ret):");
              iVar4 = getchar();
              fflush(_stdin);
              if (iVar4 == 0x1b) goto LAB_00134934;
            }
            uVar5 = (uint)*puVar6;
            goto LAB_0013474a;
          }
        }
LAB_00134767:
        if (iVar8 < 0x1e) {
          iVar8 = iVar8 + 1;
        }
        else {
          iVar8 = 0;
          printf("\nPress Return:(to quit Esc and Ret):");
          iVar4 = getchar();
          fflush(_stdin);
          if (iVar4 == 0x1b) {
LAB_00134934:
            longjmp((__jmp_buf_tag *)SD_jumpbuf,1);
          }
        }
        if (((ulong)fx_addr68k & 1) != 0) {
          printf("Misaligned pointer in LAddrFromNative %p\n",fx_addr68k);
        }
        printf("\n0x%x: Invalid, %x %x",(ulong)((long)fx_addr68k - (long)Lisp_world) >> 1,
               (ulong)*(ushort *)((ulong)fx_addr68k ^ 2),
               (ulong)*(ushort *)((ulong)&fx_addr68k->fnheader ^ 2));
        fx_addr68k = (frameex1 *)&fx_addr68k->fnheader;
      }
      else {
        if (uVar3 != 6) {
          pfVar9 = fx_addr68k;
          if (uVar3 == 7) goto LAB_00134459;
          while (uVar2 < 0x2000) {
            fx_addr68k = (frameex1 *)&fx_addr68k->fnheader;
            uVar2 = *(ushort *)((ulong)&pfVar9->fnheader ^ 2);
            pfVar9 = (frameex1 *)&pfVar9->fnheader;
          }
          goto LAB_00134767;
        }
        if (silent == 0) {
          dump_fx(fx_addr68k);
        }
        else {
          if (iVar8 < 0x1e) {
            iVar8 = iVar8 + 1;
          }
          else {
            iVar8 = 0;
            printf("\nPress Return:(to quit Esc and Ret):");
            iVar4 = getchar();
            fflush(_stdin);
            if (iVar4 == 0x1b) goto LAB_00134934;
          }
          if (((ulong)fx_addr68k & 1) != 0) {
            printf("Misaligned pointer in LAddrFromNative %p\n",fx_addr68k);
          }
          printf("\n0x%x: FX for ",(ulong)((long)fx_addr68k - (long)Lisp_world) >> 1);
          x = get_framename(fx_addr68k);
          print(x);
          printf(" [");
          uVar2 = *(ushort *)&fx_addr68k->field_0x2;
          if ((uVar2 >> 0xc & 1) != 0) {
            printf("fast,");
            uVar2 = *(ushort *)&fx_addr68k->field_0x2;
          }
          if ((uVar2 >> 10 & 1) != 0) {
            printf("incall,");
            uVar2 = *(ushort *)&fx_addr68k->field_0x2;
          }
          if ((uVar2 >> 9 & 1) != 0) {
            printf("V,");
            uVar2 = *(ushort *)&fx_addr68k->field_0x2;
          }
          if ((uVar2 >> 8 & 1) != 0) {
            printf("nopush,");
          }
          putchar(0x5d);
        }
        if (fx_addr68k == (frameex1 *)(MachineState.pvar + -10)) {
          printf(" <-***current***");
          iVar4 = (int)MachineState.endofstack;
        }
        else {
          iVar4 = (uint)fx_addr68k->nextblock * 2 + (int)Stackspace;
        }
        uVar5 = (uint)(iVar4 - (int)fx_addr68k) >> 1;
LAB_0013474a:
        if (((short)uVar5 == 0) ||
           ((long)pfVar1 - (long)fx_addr68k >> 1 < (long)(ulong)(uVar5 & 0xffff)))
        goto LAB_00134767;
        fx_addr68k = (frameex1 *)(&fx_addr68k->alink + (uVar5 & 0xffff));
      }
    } while (fx_addr68k < pfVar1);
  }
  printf("\n<< That\'s All , last stack :0x%x >>\n",(ulong)InterfacePage->endofstack);
  return;
}

Assistant:

void all_stack_dump(DLword start, DLword end, DLword silent)
/* Stack offset in DLword */
{
  STKH *stkptr;
  DLword *start68k, *end68k, *orig68k;
  DLword size;
  int sdlines = 0;

  if (start == 0)
    start68k = Stackspace + InterfacePage->stackbase;
  else
    start68k = NativeAligned2FromStackOffset(start);

  if (end == 0)
    end68k = Stackspace + InterfacePage->endofstack;
  else
    end68k = NativeAligned2FromStackOffset(end);

  stkptr = (STKH *)start68k;

  while (((DLword *)stkptr) < end68k) {
    switch (STKHPTR(stkptr)->flags1) {
      case STK_GUARD:
      case STK_FSB:
        if ((STKHPTR(stkptr)->flags2 != 0) || (STKHPTR(stkptr)->usecount != 0)) { goto badblock; }
        size = GETWORD(((DLword *)stkptr) + 1);
        if (STKHPTR(stkptr)->flags1 == STK_GUARD)
          printf("\n0x%x GUARD, size : 0x%x", LAddrFromNative(stkptr), size);
        else
          printf("\n0x%x FSB,   size : 0x%x", LAddrFromNative(stkptr), size);

        if (size <= 0 || size > ((DLword *)end68k - (DLword *)stkptr)) { goto badblock; }

        SD_morep;
        size = GETWORD(((DLword *)stkptr) + 1);
      checksize:
        if (size <= 0 || size > ((DLword *)end68k - (DLword *)stkptr)) { goto badblock; }
        stkptr = (STKH *)(((DLword *)stkptr) + size);
        break;

      case STK_FX:
        /*if((((FX *)stkptr)->pc < 24) ||
                (((FX *)stkptr)->alink==0)  ||
                 (STKHPTR(stkptr)->usecount > 31))
         {goto badblock;};*/
        if (silent) {
          SD_morep;
          printf("\n0x%x: FX for ", LAddrFromNative(stkptr));
          print(get_framename((struct frameex1 *)stkptr));
          printf(" [");
          if (((FX *)stkptr)->fast) printf("fast,");
          if (((FX *)stkptr)->incall) printf("incall,");
          if (((FX *)stkptr)->validnametable) printf("V,");
          if (((FX *)stkptr)->nopush) printf("nopush,");
          printf("]");
        } else {
          dump_fx((struct frameex1 *)stkptr);
        }

        if ((FX *)stkptr == CURRENTFX) {
          printf(" <-***current***");
          size = EndSTKP - (DLword *)stkptr;
        } else {
          size = NativeAligned2FromStackOffset(((FX *)stkptr)->nextblock) - (DLword *)stkptr;
        }
        goto checksize;
      default:
        orig68k = (DLword *)stkptr;

        while (STKHPTR(stkptr)->flags1 != STK_BF) {
          if (STKHPTR(stkptr)->flags1 != STK_NOTFLG) { goto badblock; }
          stkptr = (STKH *)(((DLword *)stkptr) + DLWORDSPER_CELL);
        }

        if ((BFRAMEPTR(stkptr))->residual) {
          if ((DLword *)stkptr != orig68k) {
            printf("\n$$$Bad BF(res):0x%x", LAddrFromNative(stkptr));
            goto incptr;
          }
        } else {
          if (BFRAMEPTR(stkptr)->ivar != StackOffsetFromNative(orig68k)) {
            printf("\n$$$BF doesn't point TopIVAR:0x%x\n", LAddrFromNative(stkptr));
            goto incptr;
          }
        }

        if (silent) {
          SD_morep;
          printf("\n0x%x BF,   ", LAddrFromNative(stkptr));
          putchar('[');
          if (BFRAMEPTR(stkptr)->residual) printf("Res,");
          if (BFRAMEPTR(stkptr)->padding) printf("Pad,");
          printf("ivar : 0x%x]", BFRAMEPTR(stkptr)->ivar);
        } else
          dump_bf((Bframe *)stkptr);

        stkptr = (STKH *)(((DLword *)stkptr) + 2);
        break;

      badblock:
        SD_morep;
        printf("\n0x%x: Invalid, %x %x", LAddrFromNative(stkptr), GETWORD((DLword *)stkptr),
               GETWORD((DLword *)(stkptr + 1)));
      incptr:
        stkptr = (STKH *)(((DLword *)stkptr) + 2);
        break;

    } /* case end */

  } /* while end */
  printf("\n<< That's All , last stack :0x%x >>\n", InterfacePage->endofstack);
}